

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O2

void __thiscall logfault::Log::~Log(Log *this)

{
  LogManager *this_00;
  Message message;
  string local_90;
  Message local_70;
  Message local_40;
  
  std::__cxx11::stringbuf::str();
  Message::Message(&local_40,&local_90,this->level_);
  std::__cxx11::string::~string((string *)&local_90);
  this_00 = LogManager::Instance();
  Message::Message(&local_70,&local_40);
  LogManager::LogMessage(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->out_);
  return;
}

Assistant:

~Log() {
            Message message(out_.str(), level_);
            LogManager::Instance().LogMessage(message);
        }